

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

unique_pointer<const_void> __thiscall
pstore::database::get_spanningu(database *this,address addr,size_t size,bool initialized)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> __dest;
  undefined7 in_register_00000009;
  int line;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  _Head_base<0UL,_const_void_*,_false> _Var5;
  uint uVar6;
  ulong uVar7;
  void *pvVar8;
  int in_R8D;
  ulong uVar9;
  ulong uVar10;
  unique_pointer<const_void> uVar11;
  char *local_40;
  
  uVar10 = CONCAT71(in_register_00000009,initialized);
  __dest._M_head_impl = (array<pstore::sat_entry,_65536UL> *)operator_new__(uVar10);
  _Var5._M_head_impl = extraout_RDX;
  if (in_R8D == 0) {
LAB_001150b4:
    this->_vptr_database = (_func_int **)deleter<void_const>;
    (this->storage_).sat_._M_t.
    super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
         __dest._M_head_impl;
    uVar11._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
    super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
    super__Head_base<0UL,_const_void_*,_false>._M_head_impl = _Var5._M_head_impl;
    uVar11._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
    super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
    super__Tuple_impl<1UL,_void_(*)(const_void_*)>.
    super__Head_base<1UL,_void_(*)(const_void_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(const_void_*),_false>)
         (_Head_base<1UL,_void_(*)(const_void_*),_false>)this;
    return (unique_pointer<const_void>)
           uVar11._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
           super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>;
  }
  uVar7 = size >> 0x16;
  lVar2 = *(long *)(addr.a_ + 8);
  uVar9 = (ulong)(((uint)uVar7 & 0xffff) << 5);
  pvVar8 = *(void **)(lVar2 + uVar9);
  line = 0x140;
  local_40 = 
  "segment_pointer.value != nullptr && segment_pointer.region != nullptr && segment_pointer.is_valid ()"
  ;
  if (((pvVar8 != (void *)0x0) && (lVar3 = *(long *)(uVar9 + lVar2 + 0x10), lVar3 != 0)) &&
     (pvVar4 = *(void **)(lVar3 + 8), pvVar4 <= pvVar8)) {
    pvVar1 = (void *)(*(long *)(lVar3 + 0x28) + (long)pvVar4);
    if ((void *)((long)pvVar8 + 0x400000U) <= pvVar1) {
      pvVar8 = (void *)((long)pvVar8 + (ulong)((uint)size & 0x3fffff));
      line = 0x148;
      local_40 = 
      "in_store_ptr >= region_base && in_store_ptr <= region_base + segment_pointer.region->size ()"
      ;
      if ((pvVar4 <= pvVar8) && (pvVar8 <= pvVar1)) {
        uVar9 = (long)pvVar4 + (*(long *)(lVar3 + 0x28) - (long)pvVar8);
        if (uVar10 <= uVar9) {
          uVar9 = uVar10;
        }
        memcpy(__dest._M_head_impl,pvVar8,uVar9);
        uVar10 = uVar10 - uVar9;
        _Var5._M_head_impl = extraout_RDX_00;
        if (uVar10 != 0) {
          pvVar8 = (void *)((long)(__dest._M_head_impl)->_M_elems + uVar9);
          local_40 = "inc < std::numeric_limits<address::segment_type>::max ()";
          do {
            uVar9 = uVar9 + 0x3fffff >> 0x16;
            if (0xfffe < uVar9) {
              line = 0x15c;
              goto LAB_001150ff;
            }
            if (0xffff < (uVar7 & 0xffff) + uVar9) {
              line = 0x15d;
              local_40 = "segment + inc < sat_elements";
              goto LAB_001150ff;
            }
            uVar6 = (int)uVar7 + (int)uVar9;
            uVar7 = (ulong)uVar6;
            lVar3 = *(long *)(lVar2 + 0x10 + (ulong)((uVar6 & 0xffff) << 5));
            if (lVar3 == 0) {
              line = 0x161;
              local_40 = "region != nullptr";
              goto LAB_001150ff;
            }
            uVar9 = *(ulong *)(lVar3 + 0x28);
            if (uVar10 <= *(ulong *)(lVar3 + 0x28)) {
              uVar9 = uVar10;
            }
            memcpy(pvVar8,*(void **)(lVar3 + 8),uVar9);
            pvVar8 = (void *)((long)pvVar8 + uVar9);
            uVar10 = uVar10 - uVar9;
            _Var5._M_head_impl = extraout_RDX_01;
          } while (uVar10 != 0);
        }
        goto LAB_001150b4;
      }
    }
  }
LAB_001150ff:
  assert_failed(local_40,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                ,line);
}

Assistant:

auto database::get_spanningu (address const addr, std::size_t const size,
                                  bool const initialized) const -> unique_pointer<void const> {
        // Create the memory block that we'll be returning, attaching a suitable deleter
        // which will be responsible for copying the data back to the store (if we're providing
        // a writable pointer).
        unique_pointer<std::uint8_t> result{new std::uint8_t[size], deleter};
        if (initialized) {
            // Copy from the data store's regions to the newly allocated memory block.
            storage_.copy<storage::copy_from_store_traits> (
                addr, size, result.get (),
                [] (std::uint8_t const * const src, std::uint8_t * const dest,
                    std::size_t const n) { std::memcpy (dest, src, n); });
        }
        return {result.release (), deleter};
    }